

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type>::
set<std::vector<wasm::Type,std::allocator<wasm::Type>>>
          (ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *list)

{
  bool bVar1;
  size_type size_00;
  reference pTVar2;
  Type elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  size_t i;
  size_t size;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *list_local;
  ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *this_local;
  
  size_00 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(list);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<wasm::Type>::allocate((ArenaVector<wasm::Type> *)this,size_00);
  }
  __range2 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x0;
  __end0 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(list);
  elem.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                *)&elem);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
             ::operator*(&__end0);
    *(uintptr_t *)(*(long *)this + (long)__range2 * 8) = pTVar2->id;
    __gnu_cxx::
    __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
    operator++(&__end0);
    __range2 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               ((long)&(__range2->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  *(size_type *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }